

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O0

ActionMessage * __thiscall
helics::FilterFederate::processMessage
          (FilterFederate *this,ActionMessage *command,BasicHandleInfo *handle)

{
  bool bVar1;
  action_t aVar2;
  uint32_t uVar3;
  FilterCoordinator *this_00;
  reference ppFVar4;
  size_type sVar5;
  BasicHandleInfo *in_RDX;
  ActionMessage *in_RSI;
  __normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
  *in_RDI;
  pair<helics::ActionMessage_&,_bool> pVar6;
  pair<helics::ActionMessage_&,_bool> press;
  FilterInfo **filt;
  iterator __end2;
  iterator __begin2;
  vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *__range2;
  size_t ii;
  Time in_stack_00000068;
  FilterCoordinator *filtFunc;
  FilterInfo *in_stack_00000340;
  ActionMessage *in_stack_00000348;
  FilterFederate *in_stack_00000350;
  vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *in_stack_ffffffffffffff68;
  __normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
  local_48;
  FilterFederate *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  InterfaceHandle handle_00;
  ulong uVar7;
  
  handle_00.hid = (BaseType)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  BasicHandleInfo::getInterfaceHandle(in_RDX);
  this_00 = getFilterCoordinator(in_stack_ffffffffffffffc0,handle_00);
  if ((this_00 != (FilterCoordinator *)0x0) && ((this_00->hasSourceFilters & 1U) != 0)) {
    uVar7 = 0;
    local_48._M_current =
         (FilterInfo **)
         std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::begin
                   (in_stack_ffffffffffffff68);
    std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::end
              (in_stack_ffffffffffffff68);
    while (bVar1 = __gnu_cxx::
                   operator==<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                             (in_RDI,(__normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                                      *)in_stack_ffffffffffffff68), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppFVar4 = __gnu_cxx::
                __normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                ::operator*(&local_48);
      bVar1 = checkActionFlag<helics::FilterInfo,helics::ConnectionFlags>
                        (*ppFVar4,disconnected_flag);
      if (!bVar1) {
        pVar6 = executeFilter(in_stack_00000350,in_stack_00000348,in_stack_00000340);
        if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          aVar2 = ActionMessage::action(in_RSI);
          if (aVar2 == cmd_ignore) {
            return in_RSI;
          }
          in_RSI->counter = (uint16_t)uVar7;
          sVar5 = std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::size
                            (&this_00->sourceFilters);
          if (uVar7 < sVar5 - 1) {
            ActionMessage::setAction(in_RSI,cmd_send_for_filter_return);
            uVar3 = std::__atomic_base<int>::operator++((__atomic_base<int> *)(in_RDI + 0x8d),0);
            in_RSI->sequenceID = uVar3;
            BasicHandleInfo::getFederateId(in_RDX);
            generateProcessMarker
                      ((FilterFederate *)ii,filtFunc._4_4_,__range2._4_4_,in_stack_00000068);
            return in_RSI;
          }
          ActionMessage::setAction(in_RSI,cmd_send_for_filter);
          return in_RSI;
        }
        uVar7 = uVar7 + 1;
      }
      __gnu_cxx::
      __normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
      ::operator++(&local_48);
    }
  }
  return in_RSI;
}

Assistant:

ActionMessage& FilterFederate::processMessage(ActionMessage& command, const BasicHandleInfo* handle)
{
    auto* filtFunc = getFilterCoordinator(handle->getInterfaceHandle());
    if (filtFunc == nullptr) {
        return command;
    }
    if (filtFunc->hasSourceFilters) {
        //   for (int ii = 0; ii < static_cast<int> (filtFunc->sourceFilters.size ()); ++ii)
        size_t ii = 0;
        for (auto& filt : filtFunc->sourceFilters) {
            if (checkActionFlag(*filt, disconnected_flag)) {
                continue;
            }
            auto press = executeFilter(command, filt);
            if (!press.second) {
                if (command.action() == CMD_IGNORE) {
                    return command;
                }
                command.counter = static_cast<uint16_t>(ii);
                if (ii < filtFunc->sourceFilters.size() - 1) {
                    command.setAction(CMD_SEND_FOR_FILTER_AND_RETURN);
                    command.sequenceID = messageCounter++;
                    generateProcessMarker(handle->getFederateId(),
                                          command.sequenceID,
                                          command.actionTime);
                } else {
                    command.setAction(CMD_SEND_FOR_FILTER);
                }
                return command;
            }
            ++ii;
        }
    }
    return command;
}